

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::texParameteri
          (ReferenceContext *this,deUint32 target,deUint32 pname,int value)

{
  pointer pTVar1;
  Texture1D *pTVar2;
  WrapMode WVar3;
  FilterMode FVar4;
  pointer pTVar5;
  long lVar6;
  
  pTVar1 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_activeTexture;
  if ((int)target < 0x8513) {
    if (target == 0xde0) {
      lVar6 = 0x30;
      pTVar5 = pTVar1;
    }
    else if (target == 0xde1) {
      lVar6 = 0x5e0;
      pTVar5 = (pointer)&pTVar1->tex2DBinding;
    }
    else {
      if (target != 0x806f) goto LAB_018a7edc;
      lVar6 = 0x3158;
      pTVar5 = (pointer)&pTVar1->tex3DBinding;
    }
  }
  else if (target == 0x8513) {
    pTVar5 = (pointer)&pTVar1->texCubeBinding;
    lVar6 = 0xb90;
  }
  else if (target == 0x8c1a) {
    pTVar5 = (pointer)&pTVar1->tex2DArrayBinding;
    lVar6 = 0x2ba8;
  }
  else {
    if (target != 0x9009) goto LAB_018a7edc;
    pTVar5 = (pointer)&pTVar1->texCubeArrayBinding;
    lVar6 = 0x3708;
  }
  pTVar2 = (Texture1D *)((long)&pTVar1->tex1DBinding + lVar6);
  if (pTVar5->tex1DBinding != (Texture1D *)0x0) {
    pTVar2 = pTVar5->tex1DBinding;
  }
  switch(pname) {
  case 0x2800:
    break;
  case 0x2801:
    switch(value) {
    case 0x2700:
      FVar4 = NEAREST_MIPMAP_NEAREST;
      break;
    case 0x2701:
      FVar4 = LINEAR_MIPMAP_NEAREST;
      break;
    case 0x2702:
      FVar4 = NEAREST_MIPMAP_LINEAR;
      break;
    case 0x2703:
      FVar4 = LINEAR_MIPMAP_LINEAR;
      break;
    default:
      if (value == 0x2600) {
        FVar4 = NEAREST;
      }
      else {
        if (value != 0x2601) goto LAB_018a7fb0;
        FVar4 = LINEAR;
      }
    }
    *(FilterMode *)((long)&(pTVar2->super_Texture).m_sampler + 0xc) = FVar4;
    return;
  case 0x2802:
    if (value == 0x8370) {
      WVar3 = MIRRORED_REPEAT_GL;
    }
    else if (value == 0x812f) {
      WVar3 = CLAMP_TO_EDGE;
    }
    else {
      if (value != 0x2901) goto LAB_018a7fb0;
      WVar3 = REPEAT_GL;
    }
    (pTVar2->super_Texture).m_sampler.wrapS = WVar3;
    return;
  case 0x2803:
    if (value == 0x8370) {
      WVar3 = MIRRORED_REPEAT_GL;
    }
    else if (value == 0x812f) {
      WVar3 = CLAMP_TO_EDGE;
    }
    else {
      if (value != 0x2901) goto LAB_018a7fb0;
      WVar3 = REPEAT_GL;
    }
    *(WrapMode *)((long)&(pTVar2->super_Texture).m_sampler + 4) = WVar3;
    return;
  default:
    if (pname == 0x8072) {
      if (value == 0x8370) {
        WVar3 = MIRRORED_REPEAT_GL;
      }
      else if (value == 0x812f) {
        WVar3 = CLAMP_TO_EDGE;
      }
      else {
        if (value != 0x2901) goto LAB_018a7fb0;
        WVar3 = REPEAT_GL;
      }
      *(WrapMode *)((long)&(pTVar2->super_Texture).m_sampler + 8) = WVar3;
      return;
    }
    if (pname != 0x813d) {
LAB_018a7edc:
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    if (-1 < value) {
      (pTVar2->super_Texture).m_maxLevel = value;
      return;
    }
LAB_018a7fb0:
    if (this->m_lastError != 0) {
      return;
    }
    this->m_lastError = 0x501;
    return;
  }
  if (value == 0x2600) {
    FVar4 = NEAREST;
  }
  else {
    if (value != 0x2601) goto LAB_018a7fb0;
    FVar4 = LINEAR;
  }
  *(FilterMode *)((long)&(pTVar2->super_Texture).m_sampler + 0x10) = FVar4;
  return;
}

Assistant:

void ReferenceContext::texParameteri (deUint32 target, deUint32 pname, int value)
{
	TextureUnit&	unit		= m_textureUnits[m_activeTexture];
	Texture*		texture		= DE_NULL;

	switch (target)
	{
		case GL_TEXTURE_1D:				texture = unit.tex1DBinding			? unit.tex1DBinding			: &unit.default1DTex;			break;
		case GL_TEXTURE_2D:				texture = unit.tex2DBinding			? unit.tex2DBinding			: &unit.default2DTex;			break;
		case GL_TEXTURE_CUBE_MAP:		texture = unit.texCubeBinding		? unit.texCubeBinding		: &unit.defaultCubeTex;			break;
		case GL_TEXTURE_2D_ARRAY:		texture = unit.tex2DArrayBinding	? unit.tex2DArrayBinding	: &unit.default2DArrayTex;		break;
		case GL_TEXTURE_3D:				texture = unit.tex3DBinding			? unit.tex3DBinding			: &unit.default3DTex;			break;
		case GL_TEXTURE_CUBE_MAP_ARRAY:	texture = unit.texCubeArrayBinding	? unit.texCubeArrayBinding	: &unit.defaultCubeArrayTex;	break;

		default:					RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}

	switch (pname)
	{
		case GL_TEXTURE_WRAP_S:
		{
			tcu::Sampler::WrapMode wrapS = mapGLWrapMode(value);
			RC_IF_ERROR(wrapS == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapS = wrapS;
			break;
		}

		case GL_TEXTURE_WRAP_T:
		{
			tcu::Sampler::WrapMode wrapT = mapGLWrapMode(value);
			RC_IF_ERROR(wrapT == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapT = wrapT;
			break;
		}

		case GL_TEXTURE_WRAP_R:
		{
			tcu::Sampler::WrapMode wrapR = mapGLWrapMode(value);
			RC_IF_ERROR(wrapR == tcu::Sampler::WRAPMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().wrapR = wrapR;
			break;
		}

		case GL_TEXTURE_MIN_FILTER:
		{
			tcu::Sampler::FilterMode minMode = mapGLFilterMode(value);
			RC_IF_ERROR(minMode == tcu::Sampler::FILTERMODE_LAST, GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().minFilter = minMode;
			break;
		}

		case GL_TEXTURE_MAG_FILTER:
		{
			tcu::Sampler::FilterMode magMode = mapGLFilterMode(value);
			RC_IF_ERROR(magMode != tcu::Sampler::LINEAR && magMode != tcu::Sampler::NEAREST,
						GL_INVALID_VALUE, RC_RET_VOID);
			texture->getSampler().magFilter = magMode;
			break;
		}

		case GL_TEXTURE_MAX_LEVEL:
		{
			RC_IF_ERROR(value < 0, GL_INVALID_VALUE, RC_RET_VOID);
			texture->setMaxLevel(value);
			break;
		}

		default:
			RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
	}
}